

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::UniformCase::generateFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,UniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms)

{
  bool bVar1;
  ostringstream local_1a0 [8];
  ostringstream result;
  bool isFragmentCase;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformCase *this_local;
  
  bVar1 = true;
  if (this->m_caseShaderType != CASESHADERTYPE_FRAGMENT) {
    bVar1 = this->m_caseShaderType == CASESHADERTYPE_BOTH;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,"#version 300 es\nin mediump float v_vtxOut;\n\n");
  if (bVar1) {
    writeUniformDefinitions(this,(ostringstream *)local_1a0);
  }
  std::operator<<((ostream *)local_1a0,
                  "\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n\nvoid main (void)\n{\n\tmediump float result = v_vtxOut;\n"
                 );
  if (bVar1) {
    writeUniformComparisons(this,(ostringstream *)local_1a0,basicUniforms,"result");
  }
  std::operator<<((ostream *)local_1a0,"\tdEQP_FragColor = vec4(result, result, result, 1.0);\n}\n")
  ;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string UniformCase::generateFragmentSource (const vector<BasicUniform>& basicUniforms) const
{
	const bool			isFragmentCase = m_caseShaderType == CASESHADERTYPE_FRAGMENT || m_caseShaderType == CASESHADERTYPE_BOTH;
	std::ostringstream	result;

	result << "#version 300 es\n"
			  "in mediump float v_vtxOut;\n"
			  "\n";

	if (isFragmentCase)
		writeUniformDefinitions(result);

	result << "\n"
			  "layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
			  "\n"
			  "void main (void)\n"
			  "{\n"
			  "	mediump float result = v_vtxOut;\n";

	if (isFragmentCase)
		writeUniformComparisons(result, basicUniforms, "result");

	result << "	dEQP_FragColor = vec4(result, result, result, 1.0);\n"
			  "}\n";

	return result.str();
}